

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

int lencode_order(lua_State *L)

{
  int n_00;
  void *__dest;
  void *ud;
  undefined1 local_68 [4];
  int n;
  bson b;
  lua_State *L_local;
  
  b.buffer._56_8_ = L;
  bson_create((bson *)local_68);
  n_00 = lua_gettop((lua_State *)b.buffer._56_8_);
  if (n_00 % 2 == 0) {
    pack_ordered_dict((lua_State *)b.buffer._56_8_,(bson *)local_68,n_00);
    lua_settop((lua_State *)b.buffer._56_8_,1);
    __dest = lua_newuserdata((lua_State *)b.buffer._56_8_,(long)(int)local_68);
    memcpy(__dest,(void *)b._0_8_,(long)(int)local_68);
    bson_destroy((bson *)local_68);
    bson_meta((lua_State *)b.buffer._56_8_);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)b.buffer._56_8_,"Invalid ordered dict");
  }
  return L_local._4_4_;
}

Assistant:

static int
lencode_order(lua_State *L) {
	struct bson b;
	bson_create(&b);
	int n = lua_gettop(L);
	if (n%2 != 0) {
		return luaL_error(L, "Invalid ordered dict");
	}
	pack_ordered_dict(L, &b, n);
	lua_settop(L,1);
	void * ud = lua_newuserdata(L, b.size);
	memcpy(ud, b.ptr, b.size);
	bson_destroy(&b);
	bson_meta(L);
	return 1;
}